

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgmrm(fitsfile *gfptr,long member,int rmopt,int *status)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  fitsfile *local_1de0;
  fitsfile *mfptr;
  char grootname [1025];
  char local_19c8 [8];
  char mrootname [1025];
  char *editLocation;
  char card [81];
  char local_1558 [8];
  char keyvalue [71];
  char *tgrplc;
  char grplc [1025];
  char local_10f8 [8];
  char keyword [75];
  char cwd [1025];
  char local_c98 [8];
  char grpLocation3 [1025];
  char local_888 [8];
  char grpLocation2 [1025];
  char local_478 [8];
  char grpLocation1 [1025];
  long local_68;
  long grpid;
  long groupExtver;
  long nmembers;
  long ngroups;
  long i;
  int iomode;
  int index;
  int hdutype;
  int found;
  int *status_local;
  long lStack_20;
  int rmopt_local;
  long member_local;
  fitsfile *gfptr_local;
  
  iomode = 0;
  i._0_4_ = 0;
  nmembers = 0;
  groupExtver = 0;
  grpid = 0;
  local_68 = 0;
  local_1de0 = (fitsfile *)0x0;
  if (*status != 0) {
    return *status;
  }
  _hdutype = status;
  status_local._4_4_ = rmopt;
  lStack_20 = member;
  member_local = (long)gfptr;
  ffflmd(gfptr,(int *)&i,status);
  if ((int)i == 1) {
    iVar1 = ffgmop((fitsfile *)member_local,lStack_20,&local_1de0,_hdutype);
    *_hdutype = iVar1;
    iVar1 = ffflmd(local_1de0,(int *)&i,_hdutype);
    *_hdutype = iVar1;
    if (status_local._4_4_ == 2) {
      iVar1 = ffghdn(local_1de0,&iomode);
      if (iVar1 == 1) {
        *_hdutype = 0x12d;
      }
      else {
        iVar1 = ffgkys(local_1de0,"EXTNAME",local_1558,(char *)&editLocation,_hdutype);
        *_hdutype = iVar1;
        if (*_hdutype == 0xca) {
          local_1558[0] = '\0';
          *_hdutype = 0;
        }
        prepare_keyvalue(local_1558);
        if (*_hdutype == 0) {
          iVar1 = fits_strcasecmp(local_1558,"GROUPING");
          if (iVar1 == 0) {
            iVar1 = ffgtnm(local_1de0,&groupExtver,_hdutype);
            *_hdutype = iVar1;
            ngroups = groupExtver;
            while( true ) {
              bVar4 = false;
              if (0 < ngroups) {
                bVar4 = *_hdutype == 0;
              }
              if (!bVar4) break;
              iVar1 = ffgmrm(local_1de0,ngroups,1,_hdutype);
              *_hdutype = iVar1;
              ngroups = ngroups + -1;
            }
            if (*_hdutype != 0) goto LAB_0020fb1e;
          }
          iVar1 = ffgmul(local_1de0,0,_hdutype);
          *_hdutype = iVar1;
          if ((*_hdutype == 0) && (ffrdef((fitsfile *)member_local,_hdutype), (int)i != 0)) {
            iVar1 = ffdhdu(local_1de0,&iomode,_hdutype);
            *_hdutype = iVar1;
          }
        }
      }
    }
    else if (status_local._4_4_ == 1) {
      if ((int)i == 1) {
        iVar1 = ffgkyj((fitsfile *)member_local,"EXTVER",&grpid,(char *)&editLocation,_hdutype);
        *_hdutype = iVar1;
        ffrtnm(local_1de0->Fptr->filename,local_19c8,_hdutype);
        ffrtnm(*(char **)(*(long *)(member_local + 8) + 0x10),(char *)&mfptr,_hdutype);
        if ((local_1de0->Fptr != *(FITSfile **)(member_local + 8)) &&
           (iVar1 = strncmp(local_19c8,(char *)&mfptr,0x401), iVar1 != 0)) {
          grpid = -grpid;
        }
        iVar1 = fits_get_url((fitsfile *)member_local,local_478,local_888,(char *)0x0,(char *)0x0,
                             (int *)0x0,_hdutype);
        *_hdutype = iVar1;
        if (*_hdutype != 0) goto LAB_0020fb1e;
        iVar1 = fits_get_cwd(keyword + 0x48,_hdutype);
        *_hdutype = iVar1;
        if (((local_478[0] != '\0') && (local_478[0] != '/')) &&
           (iVar1 = fits_is_url_absolute(local_478), iVar1 == 0)) {
          strcpy(local_c98,keyword + 0x48);
          sVar2 = strlen(local_c98);
          sVar3 = strlen(local_478);
          if (0x400 < sVar2 + sVar3 + 1) {
            ffpmsg("group locations are too long (ffgmrm)");
            *_hdutype = 0x7d;
            goto LAB_0020fb1e;
          }
          strcat(local_c98,"/");
          strcat(local_c98,local_478);
          fits_clean_url(local_c98,local_478,_hdutype);
        }
        if (((local_888[0] != '\0') && (local_888[0] != '/')) &&
           (iVar1 = fits_is_url_absolute(local_888), iVar1 == 0)) {
          strcpy(local_c98,keyword + 0x48);
          sVar2 = strlen(local_c98);
          sVar3 = strlen(local_888);
          if (0x400 < sVar2 + sVar3 + 1) {
            ffpmsg("group locations are too long (ffgmrm)");
            *_hdutype = 0x7d;
            goto LAB_0020fb1e;
          }
          strcat(local_c98,"/");
          strcat(local_c98,local_888);
          fits_clean_url(local_c98,local_888,_hdutype);
        }
        iVar1 = ffgmng(local_1de0,&nmembers,_hdutype);
        *_hdutype = iVar1;
        iVar1 = ffgrec(local_1de0,0,(char *)&editLocation,_hdutype);
        *_hdutype = iVar1;
        i._4_4_ = 1;
        index = 0;
        while( true ) {
          bVar4 = false;
          if (((int)i._4_4_ <= nmembers) && (bVar4 = false, *_hdutype == 0)) {
            bVar4 = index == 0;
          }
          if (!bVar4) break;
          snprintf(local_10f8,0x4b,"GRPID%d",(ulong)i._4_4_);
          iVar1 = ffgkyj(local_1de0,local_10f8,&local_68,(char *)&editLocation,_hdutype);
          *_hdutype = iVar1;
          if (*_hdutype == 0) {
            if ((local_68 == grpid) && (0 < local_68)) {
              index = i._4_4_;
            }
            else if ((local_68 == grpid) && (local_68 < 0)) {
              snprintf(local_10f8,0x4b,"GRPLC%d",(ulong)i._4_4_);
              iVar1 = ffgkls(local_1de0,local_10f8,(char **)(keyvalue + 0x40),(char *)&editLocation,
                             _hdutype);
              *_hdutype = iVar1;
              if (*_hdutype == 0) {
                strcpy((char *)&tgrplc,stack0xffffffffffffeaf0);
                free(stack0xffffffffffffeaf0);
              }
              if (*_hdutype == 0xca) {
                snprintf((char *)&editLocation,0x51,"No GRPLC%d found for GRPID%d",(ulong)i._4_4_,
                         (ulong)i._4_4_);
                ffpmsg((char *)&editLocation);
                *_hdutype = 0;
              }
              else if (*_hdutype == 0) {
                prepare_keyvalue((char *)&tgrplc);
                if ((((char)tgrplc != '\0') &&
                    (iVar1 = fits_is_url_absolute((char *)&tgrplc), iVar1 == 0)) &&
                   ((char)tgrplc != '/')) {
                  iVar1 = ffflnm(local_1de0,local_c98,_hdutype);
                  *_hdutype = iVar1;
                  register0x00000000 = strrchr(local_c98,0x2f);
                  if (register0x00000000 != (char *)0x0) {
                    *register0x00000000 = '\0';
                  }
                  sVar2 = strlen(local_c98);
                  sVar3 = strlen((char *)&tgrplc);
                  if (0x400 < sVar2 + sVar3 + 1) {
                    ffpmsg("group locations are too long (ffgmrm)");
                    *_hdutype = 0x7d;
                    goto LAB_0020fa2c;
                  }
                  strcat(local_c98,"/");
                  strcat(local_c98,(char *)&tgrplc);
                  iVar1 = fits_clean_url(local_c98,(char *)&tgrplc,_hdutype);
                  *_hdutype = iVar1;
                }
                iVar1 = strcmp((char *)&tgrplc,local_478);
                if ((iVar1 == 0) || (iVar1 = strcmp((char *)&tgrplc,local_888), iVar1 == 0)) {
                  index = i._4_4_;
                }
              }
            }
          }
LAB_0020fa2c:
          i._4_4_ = i._4_4_ + 1;
        }
        if (index != 0) {
          snprintf(local_10f8,0x4b,"GRPID%d",(ulong)(uint)index);
          iVar1 = ffdkey(local_1de0,local_10f8,_hdutype);
          *_hdutype = iVar1;
          snprintf(local_10f8,0x4b,"GRPLC%d",(ulong)(uint)index);
          iVar1 = ffdkey(local_1de0,local_10f8,_hdutype);
          *_hdutype = iVar1;
          *_hdutype = 0;
          iVar1 = ffgmng(local_1de0,&nmembers,_hdutype);
          *_hdutype = iVar1;
        }
      }
      iVar1 = ffdrow((fitsfile *)member_local,lStack_20,1,_hdutype);
      *_hdutype = iVar1;
    }
    else {
      *_hdutype = 0x15b;
      ffpmsg("Invalid value specified for the rmopt parameter (ffgmrm)");
    }
  }
  else {
    ffpmsg("cannot modify grouping table (ffgtam)");
    *_hdutype = 0x15e;
  }
LAB_0020fb1e:
  if (local_1de0 != (fitsfile *)0x0) {
    ffclos(local_1de0,_hdutype);
  }
  return *_hdutype;
}

Assistant:

int ffgmrm(fitsfile *gfptr,  /* FITS file pointer to group table             */
	   long      member, /* member ID (row num) in the group             */
	   int       rmopt,  /* code specifying the delete option:
				OPT_RM_ENTRY ==> delete the member entry
				OPT_RM_MBR   ==> delete entry and member HDU */
	   int      *status)  /* return status code                          */

/*
  remove a member HDU from a grouping table. The fitsfile pointer gfptr must
  be positioned with the grouping table as the CHDU, and the member to 
  delete is identified by its row number in the table (first member == 1).
  The rmopt parameter determines if the member entry is deleted from the
  grouping table (in which case GRPIDn and GRPLCn keywords in the member 
  HDU's header shall be updated accordingly) or if the member HDU shall 
  itself be removed from its FITS file.
*/

{
  int found;
  int hdutype   = 0;
  int index;
  int iomode    = 0;

  long i;
  long ngroups      = 0;
  long nmembers     = 0;
  long groupExtver  = 0;
  long grpid        = 0;

  char grpLocation1[FLEN_FILENAME];
  char grpLocation2[FLEN_FILENAME];
  char grpLocation3[FLEN_FILENAME];
  char cwd[FLEN_FILENAME];
  char keyword[FLEN_KEYWORD];
  /* SPR 1738 This can now be longer */
  char grplc[FLEN_FILENAME];
  char *tgrplc;
  char keyvalue[FLEN_VALUE];
  char card[FLEN_CARD];
  char *editLocation;
  char mrootname[FLEN_FILENAME], grootname[FLEN_FILENAME];

  fitsfile *mfptr  = NULL;


  if(*status != 0) return(*status);

  do
    {
      /*
	make sure the grouping table can be modified before proceeding
      */

      fits_file_mode(gfptr,&iomode,status);

      if(iomode != READWRITE)
	{
	  ffpmsg("cannot modify grouping table (ffgtam)");
	  *status = BAD_GROUP_DETACH;
	  continue;
	}

      /* open the group member to be deleted and get its IOstatus*/

      *status = fits_open_member(gfptr,member,&mfptr,status);
      *status = fits_file_mode(mfptr,&iomode,status);

      /*
	 if the member HDU is to be deleted then call fits_unlink_member()
	 to remove it from all groups to which it belongs (including
	 this one) and then delete it. Note that if the member is a
	 grouping table then we have to recursively call fits_remove_member()
	 for each member of the member before we delete the member itself.
      */

      if(rmopt == OPT_RM_MBR)
	{
	    /* cannot delete a PHDU */
	    if(fits_get_hdu_num(mfptr,&hdutype) == 1)
		{
		    *status = BAD_HDU_NUM;
		    continue;
		}

	  /* determine if the member HDU is itself a grouping table */

	  *status = fits_read_key_str(mfptr,"EXTNAME",keyvalue,card,status);

	  /* if no EXTNAME is found then the HDU cannot be a grouping table */ 

	  if(*status == KEY_NO_EXIST) 
	    {
	      keyvalue[0] = 0;
	      *status = 0;
	    }
	  prepare_keyvalue(keyvalue);

	  /* Any other error is a reason to abort */

	  if(*status != 0) continue;

	  /* if the EXTNAME == GROUPING then the member is a grouping table */
	  
	  if(fits_strcasecmp(keyvalue,"GROUPING") == 0)
	    {
	      /* remove each of the grouping table members */
	      
	      *status = fits_get_num_members(mfptr,&nmembers,status);
	      
	      for(i = nmembers; i > 0 && *status == 0; --i)
		*status = fits_remove_member(mfptr,i,OPT_RM_ENTRY,status);
	      
	      if(*status != 0) continue;
	    }

	  /* unlink the member HDU from all groups that contain it */

	  *status = ffgmul(mfptr,0,status);

	  if(*status != 0) continue;
 
	  /* reset the grouping table HDU struct */

	  fits_set_hdustruc(gfptr,status);

	  /* delete the member HDU */

	  if(iomode != READONLY)
	    *status = fits_delete_hdu(mfptr,&hdutype,status);
	}
      else if(rmopt == OPT_RM_ENTRY)
	{
	  /* 
	     The member HDU is only to be removed as an entry from this
	     grouping table. Actions are (1) find the GRPIDn/GRPLCn 
	     keywords that link the member to the grouping table, (2)
	     remove the GRPIDn/GRPLCn keyword from the member HDU header
	     and (3) remove the member entry from the grouping table
	  */

	  /*
	    there is no need to seach for and remove the GRPIDn/GRPLCn
	    keywords from the member HDU if it has not been opened
	    in READWRITE mode
	  */

	  if(iomode == READWRITE)
	    {	  	      
	      /* 
		 determine the group EXTVER value of the grouping table; if
		 the member HDU and grouping table HDU do not reside in the 
		 same file then set the groupExtver value to its negative 
	      */
	      
	      *status = fits_read_key_lng(gfptr,"EXTVER",&groupExtver,card,
					  status);
	      /* Now, if either the Fptr values are the same, or the root filenames
	         are the same, then assume these refer to the same file.
	      */
	      fits_parse_rootname(mfptr->Fptr->filename, mrootname, status);
	      fits_parse_rootname(gfptr->Fptr->filename, grootname, status);

	      if((mfptr->Fptr != gfptr->Fptr) && 
	          strncmp(mrootname, grootname, FLEN_FILENAME))
                       groupExtver = -1*groupExtver;
	      
	      /*
		retrieve the URLs for the grouping table; note that it is 
		possible that the grouping table file has two URLs, the 
		one used to open it and the "real" one pointing to the 
		actual file being accessed
	      */
	      
	      *status = fits_get_url(gfptr,grpLocation1,grpLocation2,NULL,
				     NULL,NULL,status);
	      
	      if(*status != 0) continue;
	      
	      /*
		if either of the group location strings specify a relative
		file path then convert them into absolute file paths
	      */

	      *status = fits_get_cwd(cwd,status);
	      
	      if(*grpLocation1 != 0 && *grpLocation1 != '/' &&
		 !fits_is_url_absolute(grpLocation1))
		{
		  strcpy(grpLocation3,cwd);
                  if (strlen(grpLocation3)+strlen(grpLocation1)+1 > 
                            FLEN_FILENAME-1)
                  {
                     ffpmsg("group locations are too long (ffgmrm)");
                     *status = URL_PARSE_ERROR;
                     continue;
                  }
		  strcat(grpLocation3,"/");
		  strcat(grpLocation3,grpLocation1);
		  fits_clean_url(grpLocation3,grpLocation1,status);
		}
	      
	      if(*grpLocation2 != 0 && *grpLocation2 != '/' &&
		 !fits_is_url_absolute(grpLocation2))
		{
		  strcpy(grpLocation3,cwd);
                  if (strlen(grpLocation3)+strlen(grpLocation2)+1 > 
                            FLEN_FILENAME-1)
                  {
                     ffpmsg("group locations are too long (ffgmrm)");
                     *status = URL_PARSE_ERROR;
                     continue;
                  }
		  strcat(grpLocation3,"/");
		  strcat(grpLocation3,grpLocation2);
		  fits_clean_url(grpLocation3,grpLocation2,status);
		}
	      
	      /*
		determine the number of groups to which the member HDU 
		belongs
	      */
	      
	      *status = fits_get_num_groups(mfptr,&ngroups,status);
	      
	      /* reset the HDU keyword position counter to the beginning */
	      
	      *status = ffgrec(mfptr,0,card,status);
	      
	      /*
		loop over all the GRPIDn keywords in the member HDU header 
		and find the appropriate GRPIDn and GRPLCn keywords that 
		identify it as belonging to the group
	      */
	      
	      for(index = 1, found = 0; index <= ngroups && *status == 0 && 
		    !found; ++index)
		{	  
		  /* read the next GRPIDn keyword in the series */
		  
		  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",index);
		  
		  *status = fits_read_key_lng(mfptr,keyword,&grpid,card,
					      status);
		  if(*status != 0) continue;
		  
		  /* 
		     grpid value == group EXTVER value then we could have a 
		     match
		  */
		  
		  if(grpid == groupExtver && grpid > 0)
		    {
		      /*
			if GRPID is positive then its a match because 
			both the member HDU and grouping table HDU reside
			in the same FITS file
		      */
		      
		      found = index;
		    }
		  else if(grpid == groupExtver && grpid < 0)
		    {
		      /* 
			 have to look at the GRPLCn value to determine a 
			 match because the member HDU and grouping table 
			 HDU reside in different FITS files
		      */
		      
		      snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",index);
		      
		      /* SPR 1738 */
		      *status = fits_read_key_longstr(mfptr,keyword,&tgrplc,
						      card, status);
		      if (0 == *status) {
			strcpy(grplc,tgrplc);
			free(tgrplc);
		      }
		      		      
		      if(*status == KEY_NO_EXIST)
			{
			  /* 
			     no GRPLCn keyword value found ==> grouping
			     convention not followed; nothing we can do 
			     about it, so just continue
			  */
			  
			  snprintf(card,FLEN_CARD,"No GRPLC%d found for GRPID%d",
				  index,index);
			  ffpmsg(card);
			  *status = 0;
			  continue;
			}
		      else if (*status != 0) continue;
		      
		      /* construct the URL for the GRPLCn value */
		      
		      prepare_keyvalue(grplc);
		      
		      /*
			if the grplc value specifies a relative path then
			turn it into a absolute file path for comparison
			purposes
		      */
		      
		      if(*grplc != 0 && !fits_is_url_absolute(grplc) &&
			 *grplc != '/')
			{
			    /* No, wrong, 
			       strcpy(grpLocation3,cwd);
			       should be */
			    *status = fits_file_name(mfptr,grpLocation3,status);
			    /* Remove everything after the last / */
			    if (NULL != (editLocation = strrchr(grpLocation3,'/'))) {
				*editLocation = '\0';
			    }
				
                          if (strlen(grpLocation3)+strlen(grplc)+1 > 
                                    FLEN_FILENAME-1)
                          {
                             ffpmsg("group locations are too long (ffgmrm)");
                             *status = URL_PARSE_ERROR;
                             continue;
                          }
			  strcat(grpLocation3,"/");
			  strcat(grpLocation3,grplc);
			  *status = fits_clean_url(grpLocation3,grplc,
						   status);
			}
		      
		      /*
			if the absolute value of GRPIDn is equal to the
			EXTVER value of the grouping table and (one of the 
			possible two) grouping table file URL matches the
			GRPLCn keyword value then we hava a match
		      */
		      
		      if(strcmp(grplc,grpLocation1) == 0  || 
			 strcmp(grplc,grpLocation2) == 0) 
			found = index; 
		    }
		}

	      /*
		if found == 0 (false) after the above search then we assume 
		that it is due to an inpromper updating of the GRPIDn and 
		GRPLCn keywords in the member header ==> nothing to delete 
		in the header. Else delete the GRPLCn and GRPIDn keywords 
		that identify the member HDU with the group HDU and 
		re-enumerate the remaining GRPIDn and GRPLCn keywords
	      */

	      if(found != 0)
		{
		  snprintf(keyword,FLEN_KEYWORD,"GRPID%d",found);
		  *status = fits_delete_key(mfptr,keyword,status);
		  
		  snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",found);
		  *status = fits_delete_key(mfptr,keyword,status);
		  
		  *status = 0;
		  
		  /* call fits_get_num_groups() to re-enumerate the GRPIDn */
		  
		  *status = fits_get_num_groups(mfptr,&ngroups,status);
		} 
	    }

	  /*
	     finally, remove the member entry from the current grouping table
	     pointed to by gfptr
	  */

	  *status = fits_delete_rows(gfptr,member,1,status);
	}
      else
	{
	  *status = BAD_OPTION;
	  ffpmsg("Invalid value specified for the rmopt parameter (ffgmrm)");
	}

    }while(0);

  if(mfptr != NULL) 
    {
      fits_close_file(mfptr,status);
    }

  return(*status);
}